

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_miniz.h
# Opt level: O0

tinfl_status
buminiz::tinfl_decompress
          (tinfl_decompressor *r,mz_uint8 *pIn_buf_next,size_t *pIn_buf_size,
          mz_uint8 *pOut_buf_start,mz_uint8 *pOut_buf_next,size_t *pOut_buf_size,
          mz_uint32 decomp_flags)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *pbVar11;
  byte bVar12;
  uint uVar13;
  byte *in_RCX;
  long *in_RDX;
  uint *in_RSI;
  undefined4 *in_RDI;
  byte *in_R8;
  ulong *in_R9;
  bool bVar14;
  uint in_stack_00000008;
  size_t block_len;
  mz_uint32 s2;
  mz_uint32 s1;
  mz_uint32 i_2;
  size_t buf_len;
  mz_uint8 *ptr;
  mz_uint c_13;
  mz_uint s_2;
  mz_uint c_12;
  mz_uint8 *pSrc_end;
  mz_uint c_11;
  mz_uint extra_bits_1;
  mz_uint c_10;
  mz_uint code_len_3;
  int temp_2;
  mz_uint c_9;
  mz_uint extra_bits;
  mz_uint code_len_2;
  int sym2;
  mz_uint c_8;
  mz_uint code_len_1;
  int temp_1;
  mz_uint8 *pSrc;
  mz_uint c_7;
  mz_uint c_6;
  mz_uint code_len;
  int temp;
  mz_uint s_1;
  mz_int16 k;
  mz_uint code_size;
  mz_uint cur_code;
  mz_uint l;
  mz_uint rev_code;
  mz_uint total_syms [16];
  mz_uint next_code [17];
  mz_uint sym_index;
  mz_uint total;
  mz_uint used_syms;
  mz_uint j;
  mz_uint i_1;
  tinfl_huff_table *pTable;
  int tree_cur;
  int tree_next;
  mz_uint c_5;
  mz_uint s;
  mz_uint c_4;
  mz_uint i;
  mz_uint8 *p;
  size_t n;
  mz_uint c_3;
  mz_uint c_2;
  mz_uint c_1;
  mz_uint c;
  size_t dist_from_out_buf_start;
  size_t out_buf_size_mask;
  mz_uint8 *pOut_buf_end;
  mz_uint8 *pOut_buf_cur;
  mz_uint8 *pIn_buf_end;
  mz_uint8 *pIn_buf_cur;
  tinfl_bit_buf_t bit_buf;
  mz_uint32 num_extra;
  mz_uint32 counter;
  mz_uint32 dist;
  mz_uint32 num_bits;
  tinfl_status status;
  byte *local_2a8;
  bool local_291;
  bool local_269;
  uint local_25c;
  bool local_241;
  size_t local_238;
  size_t local_230;
  ulong local_228;
  bool local_21a;
  bool local_219;
  byte *local_210;
  ulong local_208;
  uint local_1fc;
  uint local_1f8;
  uint local_1f4;
  ulong local_1f0;
  byte *local_1e8;
  uint local_1dc;
  uint local_1d8;
  uint local_1d4;
  uint local_1c8;
  uint local_1c0;
  int local_1bc;
  uint local_1b8;
  uint local_1b4;
  int local_1ac;
  uint local_1a8;
  uint local_1a4;
  int local_1a0;
  uint local_19c;
  byte *local_198;
  uint local_190;
  uint local_18c;
  int local_188;
  uint local_184;
  uint local_174;
  uint local_170;
  uint local_16c;
  int local_168 [16];
  uint local_128 [19];
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  undefined4 *local_c8;
  int local_c0;
  int local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  undefined4 *local_a8;
  size_t local_a0;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  ulong local_88;
  byte *local_80;
  byte *local_78;
  byte *local_70;
  uint *local_68;
  uint *local_60;
  ulong local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  tinfl_status local_3c;
  ulong *local_38;
  byte *local_30;
  byte *local_28;
  long *local_20;
  uint *local_18;
  undefined4 *local_10;
  
  local_3c = TINFL_STATUS_FAILED;
  local_68 = (uint *)((long)in_RSI + *in_RDX);
  local_78 = in_R8 + *in_R9;
  if ((in_stack_00000008 & 4) == 0) {
    local_210 = in_R8 + (*in_R9 - (long)in_RCX) + -1;
  }
  else {
    local_210 = (byte *)0xffffffffffffffff;
  }
  local_80 = local_210;
  if ((((ulong)(local_210 + 1) & (ulong)local_210) != 0) || (in_R8 < in_RCX)) {
    *in_R9 = 0;
    *in_RDX = 0;
    return TINFL_STATUS_BAD_PARAM;
  }
  local_40 = in_RDI[1];
  local_58 = *(ulong *)(in_RDI + 0xe);
  local_44 = in_RDI[8];
  local_48 = in_RDI[9];
  local_4c = in_RDI[10];
  local_88 = *(ulong *)(in_RDI + 0x10);
  local_70 = in_R8;
  local_60 = in_RSI;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  switch(*in_RDI) {
  case 0:
    in_RDI[3] = 0;
    in_RDI[2] = 0;
    local_4c = 0;
    local_48 = 0;
    local_44 = 0;
    local_40 = 0;
    local_58 = 0;
    in_RDI[7] = 1;
    in_RDI[4] = 1;
    if ((in_stack_00000008 & 1) != 0) {
      if (local_68 <= in_RSI) goto LAB_004adac8;
      local_60 = (uint *)((long)in_RSI + 1);
      in_RDI[2] = (uint)(byte)*in_RSI;
      goto LAB_004adb6e;
    }
    goto joined_r0x004add77;
  case 1:
    if (in_RSI < local_68) {
      local_60 = (uint *)((long)in_RSI + 1);
      in_RDI[2] = (uint)(byte)*in_RSI;
    }
    else {
LAB_004adac8:
      if ((in_stack_00000008 & 2) != 0) {
        local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
        *in_RDI = 1;
        break;
      }
      in_RDI[2] = 0;
    }
LAB_004adb6e:
    if (local_60 < local_68) {
      in_RDI[3] = (uint)(byte)*local_60;
      local_60 = (uint *)((long)local_60 + 1);
    }
    else {
LAB_004adb8a:
      if ((in_stack_00000008 & 2) != 0) {
        local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
        *in_RDI = 2;
        break;
      }
      in_RDI[3] = 0;
    }
    goto LAB_004adc30;
  case 2:
    if (local_68 <= in_RSI) goto LAB_004adb8a;
    local_60 = (uint *)((long)in_RSI + 1);
    in_RDI[3] = (uint)(byte)*in_RSI;
LAB_004adc30:
    local_219 = true;
    if (((uint)(in_RDI[2] * 0x100 + in_RDI[3]) % 0x1f == 0) &&
       (local_219 = true, (in_RDI[3] & 0x20) == 0)) {
      local_219 = (in_RDI[2] & 0xf) != 8;
    }
    if ((in_stack_00000008 & 4) == 0) {
      local_21a = true;
      if ((uint)(1 << ((char)((uint)in_RDI[2] >> 4) + 8U & 0x1f)) < 0x8001) {
        local_21a = local_210 + 1 < (byte *)(1L << ((char)((uint)in_RDI[2] >> 4) + 8U & 0x3f));
      }
      local_219 = (bool)(local_21a | local_219);
    }
    local_48 = (uint)local_219;
    if (local_48 == 0) {
joined_r0x004add77:
      do {
        for (; local_40 < 3; local_40 = local_40 + 8) {
          if (local_60 < local_68) {
            local_8c = (uint)(byte)*local_60;
            local_60 = (uint *)((long)local_60 + 1);
          }
          else {
LAB_004add95:
            if ((in_stack_00000008 & 2) != 0) {
              local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
              *local_10 = 3;
              goto LAB_004b0ef7;
            }
            local_8c = 0;
          }
LAB_004ade2f:
          local_58 = (ulong)local_8c << ((byte)local_40 & 0x3f) | local_58;
        }
        local_10[5] = (uint)local_58 & 7;
        local_58 = local_58 >> 3;
        local_40 = local_40 - 3;
        local_10[6] = (uint)local_10[5] >> 1;
        if (local_10[6] == 0) {
          if (local_40 < (local_40 & 7)) {
            do {
              if (local_60 < local_68) {
                local_90 = (uint)(byte)*local_60;
                local_60 = (uint *)((long)local_60 + 1);
              }
              else {
LAB_004adf0e:
                if ((in_stack_00000008 & 2) != 0) {
                  local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
                  *local_10 = 5;
                  goto LAB_004b0ef7;
                }
                local_90 = 0;
              }
LAB_004adfa8:
              local_58 = (ulong)local_90 << ((byte)local_40 & 0x3f) | local_58;
              local_40 = local_40 + 8;
            } while (local_40 < (local_40 & 7));
          }
          local_58 = local_58 >> ((byte)local_40 & 7);
          local_40 = local_40 - (local_40 & 7);
          for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
            puVar1 = local_60;
            if (local_40 == 0) {
              if (local_60 < local_68) {
                *(byte *)((long)local_10 + (ulong)local_48 + 0x2928) = (byte)*local_60;
                local_60 = (uint *)((long)local_60 + 1);
              }
              else {
LAB_004ae1c7:
                if ((in_stack_00000008 & 2) != 0) {
                  local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
                  *local_10 = 7;
                  goto LAB_004b0ef7;
                }
                *(undefined1 *)((long)local_10 + (ulong)local_48 + 0x2928) = 0;
              }
            }
            else {
              for (; local_60 = puVar1, local_40 < 8; local_40 = local_40 + 8) {
                if (puVar1 < local_68) {
                  local_60 = (uint *)((long)puVar1 + 1);
                  local_94 = (uint)(byte)*puVar1;
                }
                else {
LAB_004ae07f:
                  if ((in_stack_00000008 & 2) != 0) {
                    local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
                    *local_10 = 6;
                    goto LAB_004b0ef7;
                  }
                  local_94 = 0;
                }
LAB_004ae119:
                local_58 = (ulong)local_94 << ((byte)local_40 & 0x3f) | local_58;
                puVar1 = local_60;
              }
              *(char *)((long)local_10 + (ulong)local_48 + 0x2928) = (char)local_58;
              local_58 = local_58 >> 8;
              local_40 = local_40 - 8;
            }
LAB_004ae290:
          }
          local_48 = (uint)*(ushort *)(local_10 + 0xa4a);
          if (local_48 != (*(ushort *)((long)local_10 + 0x292a) ^ 0xffff)) goto LAB_004ae303;
          for (; puVar1 = local_60, local_48 != 0 && local_40 != 0; local_48 = local_48 - 1) {
            for (; local_60 = puVar1, local_40 < 8; local_40 = local_40 + 8) {
              if (puVar1 < local_68) {
                local_60 = (uint *)((long)puVar1 + 1);
                local_98 = (uint)(byte)*puVar1;
              }
              else {
LAB_004ae386:
                if ((in_stack_00000008 & 2) != 0) {
                  local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
                  *local_10 = 0x33;
                  goto LAB_004b0ef7;
                }
                local_98 = 0;
              }
LAB_004ae420:
              local_58 = (ulong)local_98 << ((byte)local_40 & 0x3f) | local_58;
              puVar1 = local_60;
            }
            local_44 = (uint)local_58 & 0xff;
            local_58 = local_58 >> 8;
            local_40 = local_40 - 8;
LAB_004ae4a0:
            if (local_78 <= local_70) {
              local_3c = TINFL_STATUS_HAS_MORE_OUTPUT;
              *local_10 = 0x34;
              goto LAB_004b0ef7;
            }
            *local_70 = (byte)local_44;
            local_70 = local_70 + 1;
          }
          for (; local_48 != 0; local_48 = local_48 - (int)local_a0) {
LAB_004ae520:
            if (local_78 <= local_70) {
              local_3c = TINFL_STATUS_HAS_MORE_OUTPUT;
              *local_10 = 9;
              goto LAB_004b0ef7;
            }
LAB_004ae558:
            if (local_68 <= local_60) {
              if ((in_stack_00000008 & 2) == 0) goto LAB_004ae5a1;
              local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
              *local_10 = 0x26;
              goto LAB_004b0ef7;
            }
            if ((ulong)((long)local_78 - (long)local_70) < (ulong)((long)local_68 - (long)local_60))
            {
              local_228 = (long)local_78 - (long)local_70;
            }
            else {
              local_228 = (long)local_68 - (long)local_60;
            }
            if (local_228 < local_48) {
              if ((ulong)((long)local_78 - (long)local_70) <
                  (ulong)((long)local_68 - (long)local_60)) {
                local_230 = (long)local_78 - (long)local_70;
              }
              else {
                local_230 = (long)local_68 - (long)local_60;
              }
              local_238 = local_230;
            }
            else {
              local_238 = (size_t)local_48;
            }
            local_a0 = local_238;
            memcpy(local_70,local_60,local_238);
            local_60 = (uint *)(local_a0 + (long)local_60);
            local_70 = local_70 + local_a0;
          }
        }
        else {
          if (local_10[6] == 3) goto LAB_004ae743;
          if (local_10[6] == 1) {
            local_a8 = local_10 + 0x12;
            local_10[0xb] = 0x120;
            local_10[0xc] = 0x20;
            memset(local_10 + 0x37a,5,0x20);
            for (local_ac = 0; local_ac < 0x90; local_ac = local_ac + 1) {
              *(undefined1 *)local_a8 = 8;
              local_a8 = (undefined4 *)((long)local_a8 + 1);
            }
            for (; local_ac < 0x100; local_ac = local_ac + 1) {
              *(undefined1 *)local_a8 = 9;
              local_a8 = (undefined4 *)((long)local_a8 + 1);
            }
            for (; local_ac < 0x118; local_ac = local_ac + 1) {
              *(undefined1 *)local_a8 = 7;
              local_a8 = (undefined4 *)((long)local_a8 + 1);
            }
            for (; local_ac < 0x120; local_ac = local_ac + 1) {
              *(undefined1 *)local_a8 = 8;
              local_a8 = (undefined4 *)((long)local_a8 + 1);
            }
          }
          else {
            for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
              if (local_40 < (uint)(int)"\x05\x05\x04"[local_48]) {
                do {
                  if (local_60 < local_68) {
                    local_b0 = (uint)(byte)*local_60;
                    local_60 = (uint *)((long)local_60 + 1);
                  }
                  else {
LAB_004ae921:
                    if ((in_stack_00000008 & 2) != 0) {
                      local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
                      *local_10 = 0xb;
                      goto LAB_004b0ef7;
                    }
                    local_b0 = 0;
                  }
LAB_004ae9bb:
                  local_58 = (ulong)local_b0 << ((byte)local_40 & 0x3f) | local_58;
                  local_40 = local_40 + 8;
                } while (local_40 < (uint)(int)"\x05\x05\x04"[local_48]);
              }
              local_10[(ulong)local_48 + 0xb] =
                   (uint)local_58 & (1 << ("\x05\x05\x04"[local_48] & 0x1fU)) - 1U;
              local_58 = local_58 >> ("\x05\x05\x04"[local_48] & 0x3fU);
              local_40 = local_40 - (int)"\x05\x05\x04"[local_48];
              local_10[(ulong)local_48 + 0xb] =
                   tinfl_decompress::s_min_table_sizes[local_48] + local_10[(ulong)local_48 + 0xb];
            }
            memset(local_10 + 0x6e2,0,0x120);
            for (local_48 = 0; local_48 < (uint)local_10[0xd]; local_48 = local_48 + 1) {
              for (; local_40 < 3; local_40 = local_40 + 8) {
                if (local_60 < local_68) {
                  local_b8 = (uint)(byte)*local_60;
                  local_60 = (uint *)((long)local_60 + 1);
                }
                else {
LAB_004aeb4e:
                  if ((in_stack_00000008 & 2) != 0) {
                    local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
                    *local_10 = 0xe;
                    goto LAB_004b0ef7;
                  }
                  local_b8 = 0;
                }
LAB_004aebe8:
                local_58 = (ulong)local_b8 << ((byte)local_40 & 0x3f) | local_58;
              }
              local_b4 = (uint)local_58 & 7;
              local_58 = local_58 >> 3;
              local_40 = local_40 - 3;
              *(char *)((long)local_10 + (ulong)"\x10\x11\x12"[local_48] + 0x1b88) = (char)local_b4;
            }
            local_10[0xd] = 0x13;
          }
          while (pbVar10 = local_70, -1 < (int)local_10[6]) {
            local_c8 = local_10 + (ulong)(uint)local_10[6] * 0x368 + 0x12;
            memset(local_168,0,0x40);
            memset(local_c8 + 0x48,0,0x800);
            memset(local_c8 + 0x248,0,0x480);
            for (local_cc = 0; local_cc < (uint)local_10[(ulong)(uint)local_10[6] + 0xb];
                local_cc = local_cc + 1) {
              local_168[*(byte *)((long)local_c8 + (ulong)local_cc)] =
                   local_168[*(byte *)((long)local_c8 + (ulong)local_cc)] + 1;
            }
            local_d4 = 0;
            local_d8 = 0;
            local_128[1] = 0;
            local_128[0] = 0;
            for (local_cc = 1; local_cc < 0x10; local_cc = local_cc + 1) {
              local_d4 = local_168[local_cc] + local_d4;
              local_d8 = (local_d8 + local_168[local_cc]) * 2;
              local_128[local_cc + 1] = local_d8;
            }
            if ((local_d8 != 0x10000) && (1 < local_d4)) goto LAB_004aee5b;
            local_bc = -1;
            for (local_dc = 0; local_dc < (uint)local_10[(ulong)(uint)local_10[6] + 0xb];
                local_dc = local_dc + 1) {
              local_16c = 0;
              bVar12 = *(byte *)((long)local_c8 + (ulong)local_dc);
              uVar13 = (uint)bVar12;
              if (uVar13 != 0) {
                local_174 = local_128[uVar13];
                local_128[uVar13] = local_174 + 1;
                for (local_170 = uVar13; local_170 != 0; local_170 = local_170 - 1) {
                  local_16c = local_16c << 1 | local_174 & 1;
                  local_174 = local_174 >> 1;
                }
                if (uVar13 < 0xb) {
                  for (; local_16c < 0x400; local_16c = (1 << (bVar12 & 0x1f)) + local_16c) {
                    *(ushort *)((long)local_c8 + (ulong)local_16c * 2 + 0x120) =
                         (ushort)bVar12 << 9 | (ushort)local_dc;
                  }
                }
                else {
                  local_c0 = (int)*(short *)((long)local_c8 + (ulong)(local_16c & 0x3ff) * 2 + 0x120
                                            );
                  if (local_c0 == 0) {
                    *(short *)((long)local_c8 + (ulong)(local_16c & 0x3ff) * 2 + 0x120) =
                         (short)local_bc;
                    local_c0 = local_bc;
                    local_bc = local_bc + -2;
                  }
                  local_16c = local_16c >> 9;
                  for (local_d0 = uVar13; 0xb < local_d0; local_d0 = local_d0 - 1) {
                    local_16c = local_16c >> 1;
                    local_c0 = local_c0 - (local_16c & 1);
                    if (*(short *)((long)local_c8 + (long)(-1 - local_c0) * 2 + 0x920) == 0) {
                      *(short *)((long)local_c8 + (long)(-1 - local_c0) * 2 + 0x920) =
                           (short)local_bc;
                      local_c0 = local_bc;
                      local_bc = local_bc + -2;
                    }
                    else {
                      local_c0 = (int)*(short *)((long)local_c8 + (long)(-1 - local_c0) * 2 + 0x920)
                      ;
                    }
                  }
                  local_c0 = local_c0 - (local_16c >> 1 & 1);
                  *(ushort *)((long)local_c8 + (long)(-1 - local_c0) * 2 + 0x920) = (ushort)local_dc
                  ;
                }
              }
            }
            if (local_10[6] == 2) {
              local_48 = 0;
              while (local_48 < (uint)(local_10[0xb] + local_10[0xc])) {
                if (local_40 < 0xf) {
                  if ((long)local_68 - (long)local_60 < 2) {
                    do {
                      local_184 = (uint)*(short *)((long)local_10 + (local_58 & 0x3ff) * 2 + 0x1ca8)
                      ;
                      if ((int)local_184 < 0) {
                        if (10 < local_40) {
                          local_188 = 10;
                          do {
                            local_184 = (uint)*(short *)((long)local_10 +
                                                        ((long)(int)(local_184 ^ 0xffffffff) +
                                                        (local_58 >> ((byte)local_188 & 0x3f) & 1))
                                                        * 2 + 0x24a8);
                            local_241 = (int)local_184 < 0 && local_188 + 2U <= local_40;
                            local_188 = local_188 + 1;
                          } while (local_241);
                          if (-1 < (int)local_184) break;
                        }
                      }
                      else if (((int)local_184 >> 9 != 0) &&
                              ((uint)((int)local_184 >> 9) <= local_40)) break;
                      if (local_60 < local_68) {
                        local_18c = (uint)(byte)*local_60;
                        local_60 = (uint *)((long)local_60 + 1);
                      }
                      else {
LAB_004af34c:
                        if ((in_stack_00000008 & 2) != 0) {
                          local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
                          *local_10 = 0x10;
                          goto LAB_004b0ef7;
                        }
                        local_18c = 0;
                      }
LAB_004af3e6:
                      local_58 = (ulong)local_18c << ((byte)local_40 & 0x3f) | local_58;
                      local_40 = local_40 + 8;
                    } while (local_40 < 0xf);
                  }
                  else {
                    local_58 = (ulong)(byte)*local_60 << ((byte)local_40 & 0x3f) |
                               (ulong)*(byte *)((long)local_60 + 1) << ((byte)local_40 + 8 & 0x3f) |
                               local_58;
                    local_60 = (uint *)((long)local_60 + 2);
                    local_40 = local_40 + 0x10;
                  }
                }
                local_184 = (uint)*(short *)((long)local_10 + (local_58 & 0x3ff) * 2 + 0x1ca8);
                if ((int)local_184 < 0) {
                  local_188 = 10;
                  do {
                    iVar2 = local_188 + 1;
                    local_184 = (uint)*(short *)((long)local_10 +
                                                ((long)(int)(local_184 ^ 0xffffffff) +
                                                (local_58 >> ((byte)local_188 & 0x3f) & 1)) * 2 +
                                                0x24a8);
                    local_188 = iVar2;
                  } while ((int)local_184 < 0);
                }
                else {
                  local_188 = (int)local_184 >> 9;
                  local_184 = local_184 & 0x1ff;
                }
                local_44 = local_184;
                local_58 = local_58 >> ((byte)local_188 & 0x3f);
                local_40 = local_40 - local_188;
                if (local_184 < 0x10) {
                  *(char *)((long)local_10 + (ulong)local_48 + 0x292c) = (char)local_184;
                  local_48 = local_48 + 1;
                }
                else {
                  if ((local_184 == 0x10) && (local_48 == 0)) goto LAB_004af5eb;
                  local_4c = (uint)"\x02\x03\a"[local_184 - 0x10];
                  if (local_40 < local_4c) {
                    do {
                      if (local_60 < local_68) {
                        local_190 = (uint)(byte)*local_60;
                        local_60 = (uint *)((long)local_60 + 1);
                      }
                      else {
LAB_004af65b:
                        if ((in_stack_00000008 & 2) != 0) {
                          local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
                          *local_10 = 0x12;
                          goto LAB_004b0ef7;
                        }
                        local_190 = 0;
                      }
LAB_004af6f5:
                      local_58 = (ulong)local_190 << ((byte)local_40 & 0x3f) | local_58;
                      local_40 = local_40 + 8;
                    } while (local_40 < local_4c);
                  }
                  uVar13 = (uint)local_58;
                  local_58 = local_58 >> ((byte)local_4c & 0x3f);
                  local_40 = local_40 - local_4c;
                  uVar13 = (int)"\x03\x03\v"[local_44 - 0x10] +
                           (uVar13 & (1 << ((byte)local_4c & 0x1f)) - 1U);
                  if (local_44 == 0x10) {
                    local_25c = (uint)*(byte *)((long)local_10 + (ulong)(local_48 - 1) + 0x292c);
                  }
                  else {
                    local_25c = 0;
                  }
                  memset((void *)((long)local_10 + (ulong)local_48 + 0x292c),local_25c,(ulong)uVar13
                        );
                  local_48 = uVar13 + local_48;
                }
              }
              if (local_10[0xb] + local_10[0xc] != local_48) goto LAB_004af869;
              memcpy(local_10 + 0x12,local_10 + 0xa4b,(ulong)(uint)local_10[0xb]);
              memcpy(local_10 + 0x37a,(void *)((long)local_10 + (ulong)(uint)local_10[0xb] + 0x292c)
                     ,(ulong)(uint)local_10[0xc]);
            }
            local_10[6] = local_10[6] + -1;
          }
LAB_004af918:
          while ((local_70 = pbVar10, bVar12 = (byte)local_40, (long)local_68 - (long)local_60 < 4
                 || ((long)local_78 - (long)local_70 < 2))) {
            if (local_40 < 0xf) {
              if ((long)local_68 - (long)local_60 < 2) {
                do {
                  local_19c = (uint)*(short *)((long)local_10 + (local_58 & 0x3ff) * 2 + 0x168);
                  if ((int)local_19c < 0) {
                    if (10 < local_40) {
                      local_1a0 = 10;
                      do {
                        local_19c = (uint)*(short *)((long)local_10 +
                                                    ((long)(int)(local_19c ^ 0xffffffff) +
                                                    (local_58 >> ((byte)local_1a0 & 0x3f) & 1)) * 2
                                                    + 0x968);
                        local_269 = (int)local_19c < 0 && local_1a0 + 2U <= local_40;
                        local_1a0 = local_1a0 + 1;
                      } while (local_269);
                      if (-1 < (int)local_19c) break;
                    }
                  }
                  else if (((int)local_19c >> 9 != 0) && ((uint)((int)local_19c >> 9) <= local_40))
                  break;
                  if (local_60 < local_68) {
                    local_1a4 = (uint)(byte)*local_60;
                    local_60 = (uint *)((long)local_60 + 1);
                  }
                  else {
LAB_004afaaf:
                    if ((in_stack_00000008 & 2) != 0) {
                      local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
                      *local_10 = 0x17;
                      goto LAB_004b0ef7;
                    }
                    local_1a4 = 0;
                  }
LAB_004afb49:
                  local_58 = (ulong)local_1a4 << ((byte)local_40 & 0x3f) | local_58;
                  local_40 = local_40 + 8;
                } while (local_40 < 0xf);
              }
              else {
                local_58 = (ulong)(byte)*local_60 << (bVar12 & 0x3f) |
                           (ulong)*(byte *)((long)local_60 + 1) << (bVar12 + 8 & 0x3f) | local_58;
                local_60 = (uint *)((long)local_60 + 2);
                local_40 = local_40 + 0x10;
              }
            }
            local_19c = (uint)*(short *)((long)local_10 + (local_58 & 0x3ff) * 2 + 0x168);
            if ((int)local_19c < 0) {
              local_1a0 = 10;
              do {
                iVar2 = local_1a0 + 1;
                local_19c = (uint)*(short *)((long)local_10 +
                                            ((long)(int)(local_19c ^ 0xffffffff) +
                                            (local_58 >> ((byte)local_1a0 & 0x3f) & 1)) * 2 + 0x968)
                ;
                local_1a0 = iVar2;
              } while ((int)local_19c < 0);
            }
            else {
              local_1a0 = (int)local_19c >> 9;
              local_19c = local_19c & 0x1ff;
            }
            local_48 = local_19c;
            local_58 = local_58 >> ((byte)local_1a0 & 0x3f);
            local_40 = local_40 - local_1a0;
            if (0xff < local_19c) goto LAB_004b0011;
LAB_004afd0e:
            if (local_78 <= local_70) {
              local_3c = TINFL_STATUS_HAS_MORE_OUTPUT;
              *local_10 = 0x18;
              goto LAB_004b0ef7;
            }
            *local_70 = (byte)local_48;
            pbVar10 = local_70 + 1;
          }
          if (local_40 < 0x1e) {
            local_58 = (ulong)*local_60 << (bVar12 & 0x3f) | local_58;
            local_60 = local_60 + 1;
            local_40 = local_40 + 0x20;
          }
          local_1a8 = (uint)*(short *)((long)local_10 + (local_58 & 0x3ff) * 2 + 0x168);
          if ((int)local_1a8 < 0) {
            local_1ac = 10;
            do {
              iVar2 = local_1ac + 1;
              local_1a8 = (uint)*(short *)((long)local_10 +
                                          ((long)(int)(local_1a8 ^ 0xffffffff) +
                                          (local_58 >> ((byte)local_1ac & 0x3f) & 1)) * 2 + 0x968);
              local_1ac = iVar2;
            } while ((int)local_1a8 < 0);
          }
          else {
            local_1ac = (int)local_1a8 >> 9;
          }
          uVar13 = local_1a8;
          local_48 = local_1a8;
          local_58 = local_58 >> ((byte)local_1ac & 0x3f);
          local_40 = local_40 - local_1ac;
          if ((local_1a8 & 0x100) == 0) {
            local_1a8 = (uint)*(short *)((long)local_10 + (local_58 & 0x3ff) * 2 + 0x168);
            if ((int)local_1a8 < 0) {
              local_1ac = 10;
              do {
                iVar2 = local_1ac + 1;
                local_1a8 = (uint)*(short *)((long)local_10 +
                                            ((long)(int)(local_1a8 ^ 0xffffffff) +
                                            (local_58 >> ((byte)local_1ac & 0x3f) & 1)) * 2 + 0x968)
                ;
                local_1ac = iVar2;
              } while ((int)local_1a8 < 0);
            }
            else {
              local_1ac = (int)local_1a8 >> 9;
            }
            local_58 = local_58 >> ((byte)local_1ac & 0x3f);
            local_40 = local_40 - local_1ac;
            *local_70 = (byte)uVar13;
            if ((local_1a8 & 0x100) == 0) {
              local_70[1] = (byte)local_1a8;
              pbVar10 = local_70 + 2;
              goto LAB_004af918;
            }
            local_70 = local_70 + 1;
            local_48 = local_1a8;
          }
LAB_004b0011:
          local_48 = local_48 & 0x1ff;
          if (local_48 != 0x100) {
            local_4c = tinfl_decompress::s_length_extra[local_48 - 0x101];
            local_48 = tinfl_decompress::s_length_base[local_48 - 0x101];
            if (local_4c != 0) {
              if (local_40 < local_4c) {
                do {
                  if (local_60 < local_68) {
                    local_1b4 = (uint)(byte)*local_60;
                    local_60 = (uint *)((long)local_60 + 1);
                  }
                  else {
LAB_004b00ae:
                    if ((in_stack_00000008 & 2) != 0) {
                      local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
                      *local_10 = 0x19;
                      goto LAB_004b0ef7;
                    }
                    local_1b4 = 0;
                  }
LAB_004b0148:
                  local_58 = (ulong)local_1b4 << ((byte)local_40 & 0x3f) | local_58;
                  local_40 = local_40 + 8;
                } while (local_40 < local_4c);
              }
              uVar13 = (uint)local_58;
              local_58 = local_58 >> ((byte)local_4c & 0x3f);
              local_40 = local_40 - local_4c;
              local_48 = (uVar13 & (1 << ((byte)local_4c & 0x1f)) - 1U) + local_48;
            }
            if (local_40 < 0xf) {
              if ((long)local_68 - (long)local_60 < 2) {
                do {
                  local_1b8 = (uint)*(short *)((long)local_10 + (local_58 & 0x3ff) * 2 + 0xf08);
                  if ((int)local_1b8 < 0) {
                    if (10 < local_40) {
                      local_1bc = 10;
                      do {
                        local_1b8 = (uint)*(short *)((long)local_10 +
                                                    ((long)(int)(local_1b8 ^ 0xffffffff) +
                                                    (local_58 >> ((byte)local_1bc & 0x3f) & 1)) * 2
                                                    + 0x1708);
                        local_291 = (int)local_1b8 < 0 && local_1bc + 2U <= local_40;
                        local_1bc = local_1bc + 1;
                      } while (local_291);
                      if (-1 < (int)local_1b8) break;
                    }
                  }
                  else if (((int)local_1b8 >> 9 != 0) && ((uint)((int)local_1b8 >> 9) <= local_40))
                  break;
                  if (local_60 < local_68) {
                    local_1c0 = (uint)(byte)*local_60;
                    local_60 = (uint *)((long)local_60 + 1);
                  }
                  else {
LAB_004b0363:
                    if ((in_stack_00000008 & 2) != 0) {
                      local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
                      *local_10 = 0x1a;
                      goto LAB_004b0ef7;
                    }
                    local_1c0 = 0;
                  }
LAB_004b03fd:
                  local_58 = (ulong)local_1c0 << ((byte)local_40 & 0x3f) | local_58;
                  local_40 = local_40 + 8;
                } while (local_40 < 0xf);
              }
              else {
                local_58 = (ulong)(byte)*local_60 << ((byte)local_40 & 0x3f) |
                           (ulong)*(byte *)((long)local_60 + 1) << ((byte)local_40 + 8 & 0x3f) |
                           local_58;
                local_60 = (uint *)((long)local_60 + 2);
                local_40 = local_40 + 0x10;
              }
            }
            local_1b8 = (uint)*(short *)((long)local_10 + (local_58 & 0x3ff) * 2 + 0xf08);
            if ((int)local_1b8 < 0) {
              local_1bc = 10;
              do {
                iVar2 = local_1bc + 1;
                local_1b8 = (uint)*(short *)((long)local_10 +
                                            ((long)(int)(local_1b8 ^ 0xffffffff) +
                                            (local_58 >> ((byte)local_1bc & 0x3f) & 1)) * 2 + 0x1708
                                            );
                local_1bc = iVar2;
              } while ((int)local_1b8 < 0);
            }
            else {
              local_1bc = (int)local_1b8 >> 9;
              local_1b8 = local_1b8 & 0x1ff;
            }
            local_58 = local_58 >> ((byte)local_1bc & 0x3f);
            local_40 = local_40 - local_1bc;
            local_4c = tinfl_decompress::s_dist_extra[local_1b8];
            local_44 = tinfl_decompress::s_dist_base[local_1b8];
            if (local_4c != 0) {
              if (local_40 < local_4c) {
                do {
                  if (local_60 < local_68) {
                    local_1c8 = (uint)(byte)*local_60;
                    local_60 = (uint *)((long)local_60 + 1);
                  }
                  else {
LAB_004b061e:
                    if ((in_stack_00000008 & 2) != 0) {
                      local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
                      *local_10 = 0x1b;
                      goto LAB_004b0ef7;
                    }
                    local_1c8 = 0;
                  }
LAB_004b06b8:
                  local_58 = (ulong)local_1c8 << ((byte)local_40 & 0x3f) | local_58;
                  local_40 = local_40 + 8;
                } while (local_40 < local_4c);
              }
              uVar13 = (uint)local_58;
              local_58 = local_58 >> ((byte)local_4c & 0x3f);
              local_40 = local_40 - local_4c;
              local_44 = (uVar13 & (1 << ((byte)local_4c & 0x1f)) - 1U) + local_44;
            }
            local_88 = (long)local_70 - (long)local_28;
            if ((local_88 < local_44) && ((in_stack_00000008 & 4) != 0)) goto LAB_004b07b1;
            pbVar9 = local_28 + (local_88 - local_44 & (ulong)local_80);
            local_2a8 = pbVar9;
            if (pbVar9 < local_70) {
              local_2a8 = local_70;
            }
            if (local_78 < local_2a8 + local_48) {
              while (uVar13 = local_48 - 1, bVar14 = local_48 != 0, pbVar10 = local_70,
                    local_48 = uVar13, bVar14) {
LAB_004b086a:
                if (local_78 <= local_70) {
                  local_3c = TINFL_STATUS_HAS_MORE_OUTPUT;
                  *local_10 = 0x35;
                  goto LAB_004b0ef7;
                }
                *local_70 = local_28[local_88 - local_44 & (ulong)local_80];
                local_88 = local_88 + 1;
                local_70 = local_70 + 1;
              }
              goto LAB_004af918;
            }
            pbVar10 = local_70;
            if ((8 < local_48) && (local_48 <= local_44)) {
              pbVar11 = pbVar9;
              do {
                local_70 = pbVar10;
                local_198 = pbVar11;
                *(undefined4 *)local_70 = *(undefined4 *)local_198;
                *(undefined4 *)(local_70 + 4) = *(undefined4 *)(local_198 + 4);
                pbVar10 = local_70 + 8;
                pbVar11 = local_198 + 8;
              } while (pbVar11 < pbVar9 + (local_48 & 0xfffffff8));
              local_48 = local_48 & 7;
              pbVar9 = pbVar11;
              if (local_48 < 3) {
                if (local_48 != 0) {
                  *pbVar10 = *pbVar11;
                  if (1 < local_48) {
                    local_70[9] = local_198[9];
                  }
                  pbVar10 = pbVar10 + local_48;
                }
                goto LAB_004af918;
              }
            }
            do {
              local_70 = pbVar10;
              local_198 = pbVar9;
              *local_70 = *local_198;
              local_70[1] = local_198[1];
              local_70[2] = local_198[2];
              pbVar10 = local_70 + 3;
              local_48 = local_48 - 3;
              pbVar9 = local_198 + 3;
            } while (2 < (int)local_48);
            if (0 < (int)local_48) {
              *pbVar10 = local_198[3];
              if (1 < (int)local_48) {
                local_70[4] = local_198[4];
              }
              pbVar10 = pbVar10 + local_48;
            }
            goto LAB_004af918;
          }
          local_48 = 0x100;
        }
      } while ((local_10[5] & 1) == 0);
      if ((in_stack_00000008 & 1) != 0) {
        if (local_40 < (local_40 & 7)) {
          do {
            if (local_60 < local_68) {
              local_1d4 = (uint)(byte)*local_60;
              local_60 = (uint *)((long)local_60 + 1);
            }
            else {
LAB_004b0b56:
              if ((in_stack_00000008 & 2) != 0) {
                local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
                *local_10 = 0x20;
                goto LAB_004b0ef7;
              }
              local_1d4 = 0;
            }
LAB_004b0bf0:
            local_58 = (ulong)local_1d4 << ((byte)local_40 & 0x3f) | local_58;
            local_40 = local_40 + 8;
          } while (local_40 < (local_40 & 7));
        }
        local_58 = local_58 >> ((byte)local_40 & 7);
        local_40 = local_40 - (local_40 & 7);
        for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
          puVar1 = local_60;
          if (local_40 == 0) {
            if (local_60 < local_68) {
              local_1d8 = (uint)(byte)*local_60;
              local_60 = (uint *)((long)local_60 + 1);
            }
            else {
LAB_004b0dfa:
              if ((in_stack_00000008 & 2) != 0) {
                local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
                *local_10 = 0x2a;
                goto LAB_004b0ef7;
              }
              local_1d8 = 0;
            }
          }
          else {
            for (; local_60 = puVar1, local_40 < 8; local_40 = local_40 + 8) {
              if (puVar1 < local_68) {
                local_60 = (uint *)((long)puVar1 + 1);
                local_1dc = (uint)(byte)*puVar1;
              }
              else {
LAB_004b0cc7:
                if ((in_stack_00000008 & 2) != 0) {
                  local_3c = TINFL_STATUS_NEEDS_MORE_INPUT;
                  *local_10 = 0x29;
                  goto LAB_004b0ef7;
                }
                local_1dc = 0;
              }
LAB_004b0d61:
              local_58 = (ulong)local_1dc << ((byte)local_40 & 0x3f) | local_58;
              puVar1 = local_60;
            }
            local_1d8 = (uint)local_58 & 0xff;
            local_58 = local_58 >> 8;
            local_40 = local_40 - 8;
          }
LAB_004b0e98:
          local_10[4] = local_10[4] << 8 | local_1d8;
        }
      }
LAB_004b0ed4:
      local_3c = TINFL_STATUS_DONE;
      *local_10 = 0x22;
    }
    else {
LAB_004add45:
      local_3c = TINFL_STATUS_FAILED;
      *in_RDI = 0x24;
    }
    break;
  case 3:
    if (local_68 <= in_RSI) goto LAB_004add95;
    local_60 = (uint *)((long)in_RSI + 1);
    local_8c = (uint)(byte)*in_RSI;
    goto LAB_004ade2f;
  default:
    break;
  case 5:
    if (local_68 <= in_RSI) goto LAB_004adf0e;
    local_60 = (uint *)((long)in_RSI + 1);
    local_90 = (uint)(byte)*in_RSI;
    goto LAB_004adfa8;
  case 6:
    local_60 = in_RSI;
    if (local_68 <= in_RSI) goto LAB_004ae07f;
    local_60 = (uint *)((long)in_RSI + 1);
    local_94 = (uint)(byte)*in_RSI;
    goto LAB_004ae119;
  case 7:
    if (local_68 <= in_RSI) goto LAB_004ae1c7;
    local_60 = (uint *)((long)in_RSI + 1);
    *(byte *)((long)in_RDI + (ulong)local_48 + 0x2928) = (byte)*in_RSI;
    goto LAB_004ae290;
  case 9:
    goto LAB_004ae520;
  case 10:
LAB_004ae743:
    local_3c = TINFL_STATUS_FAILED;
    *local_10 = 10;
    break;
  case 0xb:
    if (local_68 <= in_RSI) goto LAB_004ae921;
    local_60 = (uint *)((long)in_RSI + 1);
    local_b0 = (uint)(byte)*in_RSI;
    goto LAB_004ae9bb;
  case 0xe:
    if (local_68 <= in_RSI) goto LAB_004aeb4e;
    local_60 = (uint *)((long)in_RSI + 1);
    local_b8 = (uint)(byte)*in_RSI;
    goto LAB_004aebe8;
  case 0x10:
    if (local_68 <= in_RSI) goto LAB_004af34c;
    local_60 = (uint *)((long)in_RSI + 1);
    local_18c = (uint)(byte)*in_RSI;
    goto LAB_004af3e6;
  case 0x11:
LAB_004af5eb:
    local_3c = TINFL_STATUS_FAILED;
    *local_10 = 0x11;
    break;
  case 0x12:
    if (local_68 <= in_RSI) goto LAB_004af65b;
    local_60 = (uint *)((long)in_RSI + 1);
    local_190 = (uint)(byte)*in_RSI;
    goto LAB_004af6f5;
  case 0x15:
LAB_004af869:
    local_3c = TINFL_STATUS_FAILED;
    *local_10 = 0x15;
    break;
  case 0x17:
    if (local_68 <= in_RSI) goto LAB_004afaaf;
    local_60 = (uint *)((long)in_RSI + 1);
    local_1a4 = (uint)(byte)*in_RSI;
    goto LAB_004afb49;
  case 0x18:
    goto LAB_004afd0e;
  case 0x19:
    if (local_68 <= in_RSI) goto LAB_004b00ae;
    local_60 = (uint *)((long)in_RSI + 1);
    local_1b4 = (uint)(byte)*in_RSI;
    goto LAB_004b0148;
  case 0x1a:
    if (local_68 <= in_RSI) goto LAB_004b0363;
    local_60 = (uint *)((long)in_RSI + 1);
    local_1c0 = (uint)(byte)*in_RSI;
    goto LAB_004b03fd;
  case 0x1b:
    if (local_68 <= in_RSI) goto LAB_004b061e;
    local_60 = (uint *)((long)in_RSI + 1);
    local_1c8 = (uint)(byte)*in_RSI;
    goto LAB_004b06b8;
  case 0x20:
    if (local_68 <= in_RSI) goto LAB_004b0b56;
    local_60 = (uint *)((long)in_RSI + 1);
    local_1d4 = (uint)(byte)*in_RSI;
    goto LAB_004b0bf0;
  case 0x22:
    goto LAB_004b0ed4;
  case 0x23:
LAB_004aee5b:
    local_3c = TINFL_STATUS_FAILED;
    *local_10 = 0x23;
    break;
  case 0x24:
    goto LAB_004add45;
  case 0x25:
LAB_004b07b1:
    local_3c = TINFL_STATUS_FAILED;
    *local_10 = 0x25;
    break;
  case 0x26:
    goto LAB_004ae558;
  case 0x27:
LAB_004ae303:
    local_3c = TINFL_STATUS_FAILED;
    *local_10 = 0x27;
    break;
  case 0x28:
LAB_004ae5a1:
    local_3c = TINFL_STATUS_FAILED;
    *local_10 = 0x28;
    break;
  case 0x29:
    local_60 = in_RSI;
    if (local_68 <= in_RSI) goto LAB_004b0cc7;
    local_60 = (uint *)((long)in_RSI + 1);
    local_1dc = (uint)(byte)*in_RSI;
    goto LAB_004b0d61;
  case 0x2a:
    if (local_68 <= in_RSI) goto LAB_004b0dfa;
    local_60 = (uint *)((long)in_RSI + 1);
    local_1d8 = (uint)(byte)*in_RSI;
    goto LAB_004b0e98;
  case 0x33:
    local_60 = in_RSI;
    if (local_68 <= in_RSI) goto LAB_004ae386;
    local_60 = (uint *)((long)in_RSI + 1);
    local_98 = (uint)(byte)*in_RSI;
    goto LAB_004ae420;
  case 0x34:
    goto LAB_004ae4a0;
  case 0x35:
    goto LAB_004b086a;
  }
LAB_004b0ef7:
  local_10[1] = local_40;
  *(ulong *)(local_10 + 0xe) = local_58;
  local_10[8] = local_44;
  local_10[9] = local_48;
  local_10[10] = local_4c;
  *(ulong *)(local_10 + 0x10) = local_88;
  *local_20 = (long)local_60 - (long)local_18;
  *local_38 = (long)local_70 - (long)local_30;
  if (((in_stack_00000008 & 8) != 0) && (TINFL_STATUS_FAILED < local_3c)) {
    local_1e8 = local_30;
    local_1f0 = *local_38;
    local_1f8 = local_10[7] & 0xffff;
    local_1fc = (uint)local_10[7] >> 0x10;
    local_208 = local_1f0 % 0x15b0;
    while (local_1f0 != 0) {
      for (local_1f4 = 0; local_1f4 + 7 < local_208; local_1f4 = local_1f4 + 8) {
        iVar2 = *local_1e8 + local_1f8;
        iVar3 = (uint)local_1e8[1] + iVar2;
        iVar4 = (uint)local_1e8[2] + iVar3;
        iVar5 = (uint)local_1e8[3] + iVar4;
        iVar6 = (uint)local_1e8[4] + iVar5;
        iVar7 = (uint)local_1e8[5] + iVar6;
        iVar8 = (uint)local_1e8[6] + iVar7;
        local_1f8 = (uint)local_1e8[7] + iVar8;
        local_1fc = local_1f8 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + local_1fc;
        local_1e8 = local_1e8 + 8;
      }
      for (; local_1f4 < local_208; local_1f4 = local_1f4 + 1) {
        local_1f8 = *local_1e8 + local_1f8;
        local_1fc = local_1f8 + local_1fc;
        local_1e8 = local_1e8 + 1;
      }
      local_1f8 = local_1f8 % 0xfff1;
      local_1fc = local_1fc % 0xfff1;
      local_1f0 = local_1f0 - local_208;
      local_208 = 0x15b0;
    }
    local_10[7] = local_1fc * 0x10000 + local_1f8;
    if (((local_3c == TINFL_STATUS_DONE) && ((in_stack_00000008 & 1) != 0)) &&
       (local_10[7] != local_10[4])) {
      local_3c = TINFL_STATUS_ADLER32_MISMATCH;
    }
  }
  return local_3c;
}

Assistant:

tinfl_status tinfl_decompress(tinfl_decompressor *r, const mz_uint8 *pIn_buf_next, size_t *pIn_buf_size, mz_uint8 *pOut_buf_start, mz_uint8 *pOut_buf_next, size_t *pOut_buf_size, const mz_uint32 decomp_flags)
{
  static const int s_length_base[31] = { 3,4,5,6,7,8,9,10,11,13, 15,17,19,23,27,31,35,43,51,59, 67,83,99,115,131,163,195,227,258,0,0 };
  static const int s_length_extra[31]= { 0,0,0,0,0,0,0,0,1,1,1,1,2,2,2,2,3,3,3,3,4,4,4,4,5,5,5,5,0,0,0 };
  static const int s_dist_base[32] = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193, 257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577,0,0};
  static const int s_dist_extra[32] = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13};
  static const mz_uint8 s_length_dezigzag[19] = { 16,17,18,0,8,7,9,6,10,5,11,4,12,3,13,2,14,1,15 };
  static const int s_min_table_sizes[3] = { 257, 1, 4 };

  tinfl_status status = TINFL_STATUS_FAILED; mz_uint32 num_bits, dist, counter, num_extra; tinfl_bit_buf_t bit_buf;
  const mz_uint8 *pIn_buf_cur = pIn_buf_next, *const pIn_buf_end = pIn_buf_next + *pIn_buf_size;
  mz_uint8 *pOut_buf_cur = pOut_buf_next, *const pOut_buf_end = pOut_buf_next + *pOut_buf_size;
  size_t out_buf_size_mask = (decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF) ? (size_t)-1 : ((pOut_buf_next - pOut_buf_start) + *pOut_buf_size) - 1, dist_from_out_buf_start;

  // Ensure the output buffer's size is a power of 2, unless the output buffer is large enough to hold the entire output file (in which case it doesn't matter).
  if (((out_buf_size_mask + 1) & out_buf_size_mask) || (pOut_buf_next < pOut_buf_start)) { *pIn_buf_size = *pOut_buf_size = 0; return TINFL_STATUS_BAD_PARAM; }

  num_bits = r->m_num_bits; bit_buf = r->m_bit_buf; dist = r->m_dist; counter = r->m_counter; num_extra = r->m_num_extra; dist_from_out_buf_start = r->m_dist_from_out_buf_start;
  TINFL_CR_BEGIN

  bit_buf = num_bits = dist = counter = num_extra = r->m_zhdr0 = r->m_zhdr1 = 0; r->m_z_adler32 = r->m_check_adler32 = 1;
  if (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER)
  {
    TINFL_GET_BYTE(1, r->m_zhdr0); TINFL_GET_BYTE(2, r->m_zhdr1);
    counter = (((r->m_zhdr0 * 256 + r->m_zhdr1) % 31 != 0) || (r->m_zhdr1 & 32) || ((r->m_zhdr0 & 15) != 8));
    if (!(decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF)) counter |= (((1U << (8U + (r->m_zhdr0 >> 4))) > 32768U) || ((out_buf_size_mask + 1) < (size_t)(1ULL << (8U + (r->m_zhdr0 >> 4)))));
    if (counter) { TINFL_CR_RETURN_FOREVER(36, TINFL_STATUS_FAILED); }
  }

  do
  {
    TINFL_GET_BITS(3, r->m_final, 3); r->m_type = r->m_final >> 1;
    if (r->m_type == 0)
    {
      TINFL_SKIP_BITS(5, num_bits & 7);
      for (counter = 0; counter < 4; ++counter) { if (num_bits) TINFL_GET_BITS(6, r->m_raw_header[counter], 8); else TINFL_GET_BYTE(7, r->m_raw_header[counter]); }
      if ((counter = (r->m_raw_header[0] | (r->m_raw_header[1] << 8))) != (mz_uint)(0xFFFF ^ (r->m_raw_header[2] | (r->m_raw_header[3] << 8)))) { TINFL_CR_RETURN_FOREVER(39, TINFL_STATUS_FAILED); }
      while ((counter) && (num_bits))
      {
        TINFL_GET_BITS(51, dist, 8);
        while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(52, TINFL_STATUS_HAS_MORE_OUTPUT); }
        *pOut_buf_cur++ = (mz_uint8)dist;
        counter--;
      }
      while (counter)
      {
        size_t n; while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(9, TINFL_STATUS_HAS_MORE_OUTPUT); }
        while (pIn_buf_cur >= pIn_buf_end)
        {
          if (decomp_flags & TINFL_FLAG_HAS_MORE_INPUT)
          {
            TINFL_CR_RETURN(38, TINFL_STATUS_NEEDS_MORE_INPUT);
          }
          else
          {
            TINFL_CR_RETURN_FOREVER(40, TINFL_STATUS_FAILED);
          }
        }
        n = MZ_MIN(MZ_MIN((size_t)(pOut_buf_end - pOut_buf_cur), (size_t)(pIn_buf_end - pIn_buf_cur)), counter);
        TINFL_MEMCPY(pOut_buf_cur, pIn_buf_cur, n); pIn_buf_cur += n; pOut_buf_cur += n; counter -= (mz_uint)n;
      }
    }
    else if (r->m_type == 3)
    {
      TINFL_CR_RETURN_FOREVER(10, TINFL_STATUS_FAILED);
    }
    else
    {
      if (r->m_type == 1)
      {
        mz_uint8 *p = r->m_tables[0].m_code_size; mz_uint i;
        r->m_table_sizes[0] = 288; r->m_table_sizes[1] = 32; TINFL_MEMSET(r->m_tables[1].m_code_size, 5, 32);
        for ( i = 0; i <= 143; ++i) *p++ = 8;
        for ( ; i <= 255; ++i) *p++ = 9;
        for ( ; i <= 279; ++i) *p++ = 7;
        for ( ; i <= 287; ++i) *p++ = 8;
      }
      else
      {
        for (counter = 0; counter < 3; counter++) { TINFL_GET_BITS(11, r->m_table_sizes[counter], "\05\05\04"[counter]); r->m_table_sizes[counter] += s_min_table_sizes[counter]; }
        MZ_CLEAR_OBJ(r->m_tables[2].m_code_size); for (counter = 0; counter < r->m_table_sizes[2]; counter++) { mz_uint s; TINFL_GET_BITS(14, s, 3); r->m_tables[2].m_code_size[s_length_dezigzag[counter]] = (mz_uint8)s; }
        r->m_table_sizes[2] = 19;
      }
      for ( ; (int)r->m_type >= 0; r->m_type--)
      {
        int tree_next, tree_cur; tinfl_huff_table *pTable;
        mz_uint i, j, used_syms, total, sym_index, next_code[17], total_syms[16]; pTable = &r->m_tables[r->m_type]; MZ_CLEAR_OBJ(total_syms); MZ_CLEAR_OBJ(pTable->m_look_up); MZ_CLEAR_OBJ(pTable->m_tree);
        for (i = 0; i < r->m_table_sizes[r->m_type]; ++i) total_syms[pTable->m_code_size[i]]++;
        used_syms = 0, total = 0; next_code[0] = next_code[1] = 0;
        for (i = 1; i <= 15; ++i) { used_syms += total_syms[i]; next_code[i + 1] = (total = ((total + total_syms[i]) << 1)); }
        if ((65536 != total) && (used_syms > 1))
        {
          TINFL_CR_RETURN_FOREVER(35, TINFL_STATUS_FAILED);
        }
        for (tree_next = -1, sym_index = 0; sym_index < r->m_table_sizes[r->m_type]; ++sym_index)
        {
          mz_uint rev_code = 0, l, cur_code, code_size = pTable->m_code_size[sym_index]; if (!code_size) continue;
          cur_code = next_code[code_size]++; for (l = code_size; l > 0; l--, cur_code >>= 1) rev_code = (rev_code << 1) | (cur_code & 1);
          if (code_size <= TINFL_FAST_LOOKUP_BITS) { mz_int16 k = (mz_int16)((code_size << 9) | sym_index); while (rev_code < TINFL_FAST_LOOKUP_SIZE) { pTable->m_look_up[rev_code] = k; rev_code += (1 << code_size); } continue; }
          if (0 == (tree_cur = pTable->m_look_up[rev_code & (TINFL_FAST_LOOKUP_SIZE - 1)])) { pTable->m_look_up[rev_code & (TINFL_FAST_LOOKUP_SIZE - 1)] = (mz_int16)tree_next; tree_cur = tree_next; tree_next -= 2; }
          rev_code >>= (TINFL_FAST_LOOKUP_BITS - 1);
          for (j = code_size; j > (TINFL_FAST_LOOKUP_BITS + 1); j--)
          {
            tree_cur -= ((rev_code >>= 1) & 1);
            if (!pTable->m_tree[-tree_cur - 1]) { pTable->m_tree[-tree_cur - 1] = (mz_int16)tree_next; tree_cur = tree_next; tree_next -= 2; } else tree_cur = pTable->m_tree[-tree_cur - 1];
          }
          tree_cur -= ((rev_code >>= 1) & 1); pTable->m_tree[-tree_cur - 1] = (mz_int16)sym_index;
        }
        if (r->m_type == 2)
        {
          for (counter = 0; counter < (r->m_table_sizes[0] + r->m_table_sizes[1]); )
          {
            mz_uint s; TINFL_HUFF_DECODE(16, dist, &r->m_tables[2]); if (dist < 16) { r->m_len_codes[counter++] = (mz_uint8)dist; continue; }
            if ((dist == 16) && (!counter))
            {
              TINFL_CR_RETURN_FOREVER(17, TINFL_STATUS_FAILED);
            }
            num_extra = "\02\03\07"[dist - 16]; TINFL_GET_BITS(18, s, num_extra); s += "\03\03\013"[dist - 16];
            TINFL_MEMSET(r->m_len_codes + counter, (dist == 16) ? r->m_len_codes[counter - 1] : 0, s); counter += s;
          }
          if ((r->m_table_sizes[0] + r->m_table_sizes[1]) != counter)
          {
            TINFL_CR_RETURN_FOREVER(21, TINFL_STATUS_FAILED);
          }
          TINFL_MEMCPY(r->m_tables[0].m_code_size, r->m_len_codes, r->m_table_sizes[0]); TINFL_MEMCPY(r->m_tables[1].m_code_size, r->m_len_codes + r->m_table_sizes[0], r->m_table_sizes[1]);
        }
      }
      for ( ; ; )
      {
        mz_uint8 *pSrc;
        for ( ; ; )
        {
          if (((pIn_buf_end - pIn_buf_cur) < 4) || ((pOut_buf_end - pOut_buf_cur) < 2))
          {
            TINFL_HUFF_DECODE(23, counter, &r->m_tables[0]);
            if (counter >= 256)
              break;
            while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(24, TINFL_STATUS_HAS_MORE_OUTPUT); }
            *pOut_buf_cur++ = (mz_uint8)counter;
          }
          else
          {
            int sym2; mz_uint code_len;
#if TINFL_USE_64BIT_BITBUF
            if (num_bits < 30) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE32(pIn_buf_cur)) << num_bits); pIn_buf_cur += 4; num_bits += 32; }
#else
            if (num_bits < 15) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE16(pIn_buf_cur)) << num_bits); pIn_buf_cur += 2; num_bits += 16; }
#endif
            if ((sym2 = r->m_tables[0].m_look_up[bit_buf & (TINFL_FAST_LOOKUP_SIZE - 1)]) >= 0)
              code_len = sym2 >> 9;
            else
            {
              code_len = TINFL_FAST_LOOKUP_BITS; do { sym2 = r->m_tables[0].m_tree[~sym2 + ((bit_buf >> code_len++) & 1)]; } while (sym2 < 0);
            }
            counter = sym2; bit_buf >>= code_len; num_bits -= code_len;
            if (counter & 256)
              break;

#if !TINFL_USE_64BIT_BITBUF
            if (num_bits < 15) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE16(pIn_buf_cur)) << num_bits); pIn_buf_cur += 2; num_bits += 16; }
#endif
            if ((sym2 = r->m_tables[0].m_look_up[bit_buf & (TINFL_FAST_LOOKUP_SIZE - 1)]) >= 0)
              code_len = sym2 >> 9;
            else
            {
              code_len = TINFL_FAST_LOOKUP_BITS; do { sym2 = r->m_tables[0].m_tree[~sym2 + ((bit_buf >> code_len++) & 1)]; } while (sym2 < 0);
            }
            bit_buf >>= code_len; num_bits -= code_len;

            pOut_buf_cur[0] = (mz_uint8)counter;
            if (sym2 & 256)
            {
              pOut_buf_cur++;
              counter = sym2;
              break;
            }
            pOut_buf_cur[1] = (mz_uint8)sym2;
            pOut_buf_cur += 2;
          }
        }
        if ((counter &= 511) == 256) break;

        num_extra = s_length_extra[counter - 257]; counter = s_length_base[counter - 257];
        if (num_extra) { mz_uint extra_bits; TINFL_GET_BITS(25, extra_bits, num_extra); counter += extra_bits; }

        TINFL_HUFF_DECODE(26, dist, &r->m_tables[1]);
        num_extra = s_dist_extra[dist]; dist = s_dist_base[dist];
        if (num_extra) { mz_uint extra_bits; TINFL_GET_BITS(27, extra_bits, num_extra); dist += extra_bits; }

        dist_from_out_buf_start = pOut_buf_cur - pOut_buf_start;
        if ((dist > dist_from_out_buf_start) && (decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF))
        {
          TINFL_CR_RETURN_FOREVER(37, TINFL_STATUS_FAILED);
        }

        pSrc = pOut_buf_start + ((dist_from_out_buf_start - dist) & out_buf_size_mask);

        if ((MZ_MAX(pOut_buf_cur, pSrc) + counter) > pOut_buf_end)
        {
          while (counter--)
          {
            while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(53, TINFL_STATUS_HAS_MORE_OUTPUT); }
            *pOut_buf_cur++ = pOut_buf_start[(dist_from_out_buf_start++ - dist) & out_buf_size_mask];
          }
          continue;
        }
#if MINIZ_USE_UNALIGNED_LOADS_AND_STORES
        else if ((counter >= 9) && (counter <= dist))
        {
          const mz_uint8 *pSrc_end = pSrc + (counter & ~7);
          do
          {
            ((mz_uint32 *)pOut_buf_cur)[0] = ((const mz_uint32 *)pSrc)[0];
            ((mz_uint32 *)pOut_buf_cur)[1] = ((const mz_uint32 *)pSrc)[1];
            pOut_buf_cur += 8;
          } while ((pSrc += 8) < pSrc_end);
          if ((counter &= 7) < 3)
          {
            if (counter)
            {
              pOut_buf_cur[0] = pSrc[0];
              if (counter > 1)
                pOut_buf_cur[1] = pSrc[1];
              pOut_buf_cur += counter;
            }
            continue;
          }
        }
#endif
        do
        {
          pOut_buf_cur[0] = pSrc[0];
          pOut_buf_cur[1] = pSrc[1];
          pOut_buf_cur[2] = pSrc[2];
          pOut_buf_cur += 3; pSrc += 3;
        } while ((int)(counter -= 3) > 2);
        if ((int)counter > 0)
        {
          pOut_buf_cur[0] = pSrc[0];
          if ((int)counter > 1)
            pOut_buf_cur[1] = pSrc[1];
          pOut_buf_cur += counter;
        }
      }
    }
  } while (!(r->m_final & 1));
  if (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER)
  {
    TINFL_SKIP_BITS(32, num_bits & 7); for (counter = 0; counter < 4; ++counter) { mz_uint s; if (num_bits) TINFL_GET_BITS(41, s, 8); else TINFL_GET_BYTE(42, s); r->m_z_adler32 = (r->m_z_adler32 << 8) | s; }
  }
  TINFL_CR_RETURN_FOREVER(34, TINFL_STATUS_DONE);
  TINFL_CR_FINISH

common_exit:
  r->m_num_bits = num_bits; r->m_bit_buf = bit_buf; r->m_dist = dist; r->m_counter = counter; r->m_num_extra = num_extra; r->m_dist_from_out_buf_start = dist_from_out_buf_start;
  *pIn_buf_size = pIn_buf_cur - pIn_buf_next; *pOut_buf_size = pOut_buf_cur - pOut_buf_next;
  //if ((decomp_flags & (TINFL_FLAG_PARSE_ZLIB_HEADER | TINFL_FLAG_COMPUTE_ADLER32)) && (status >= 0))
  if ((decomp_flags & TINFL_FLAG_COMPUTE_ADLER32) && (status >= 0))
  {
    const mz_uint8 *ptr = pOut_buf_next; size_t buf_len = *pOut_buf_size;
    mz_uint32 i, s1 = r->m_check_adler32 & 0xffff, s2 = r->m_check_adler32 >> 16; size_t block_len = buf_len % 5552;
    while (buf_len)
    {
      for (i = 0; i + 7 < block_len; i += 8, ptr += 8)
      {
        s1 += ptr[0], s2 += s1; s1 += ptr[1], s2 += s1; s1 += ptr[2], s2 += s1; s1 += ptr[3], s2 += s1;
        s1 += ptr[4], s2 += s1; s1 += ptr[5], s2 += s1; s1 += ptr[6], s2 += s1; s1 += ptr[7], s2 += s1;
      }
      for ( ; i < block_len; ++i) s1 += *ptr++, s2 += s1;
      s1 %= 65521U, s2 %= 65521U; buf_len -= block_len; block_len = 5552;
    }
    r->m_check_adler32 = (s2 << 16) + s1; 
    if ((status == TINFL_STATUS_DONE) && (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER) && (r->m_check_adler32 != r->m_z_adler32)) 
        status = TINFL_STATUS_ADLER32_MISMATCH;
  }
  return status;
}